

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict compound_stmt(c2m_ctx_t c2m_ctx,int no_err_p)

{
  short sVar1;
  parse_ctx *ppVar2;
  pos_t p;
  int iVar3;
  node_t_conflict op2;
  node_t_conflict pnVar4;
  node_t_conflict op;
  char *expected_name;
  pos_t pos;
  
  ppVar2 = c2m_ctx->parse_ctx;
  iVar3 = match(c2m_ctx,0x7b,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar3 == 0) {
    error_recovery(c2m_ctx,0,"{");
  }
  else {
    op2 = new_node(c2m_ctx,N_LIST);
    pnVar4 = new_node(c2m_ctx,N_LIST);
    p.lno = pos.lno;
    p.ln_pos = pos.ln_pos;
    p.fname = pos.fname;
    pnVar4 = new_pos_node2(c2m_ctx,N_BLOCK,p,pnVar4,op2);
    pnVar4->attr = ppVar2->curr_scope;
    ppVar2->curr_scope = pnVar4;
    while( true ) {
      sVar1 = *(short *)ppVar2->curr_token;
      if ((sVar1 == 0x7d) || (sVar1 == 0x13d)) break;
      op = try_f(c2m_ctx,declaration);
      if ((op == &err_struct) && (op = stmt(c2m_ctx,no_err_p), op == &err_struct)) {
        error_recovery(c2m_ctx,1,"<statement>");
      }
      else {
        op_flat_append(c2m_ctx,op2,op);
      }
    }
    ppVar2->curr_scope = (node_t_conflict)pnVar4->attr;
    if (*(short *)ppVar2->curr_token == 0x13d) {
      error(c2m_ctx,0x18eb5c,pos.fname,pos._8_8_);
    }
    else {
      iVar3 = match(c2m_ctx,0x7d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar3 != 0) {
        return pnVar4;
      }
      if (ppVar2->record_level == 0) {
        expected_name = get_token_name(c2m_ctx,0x7d);
        syntax_error(c2m_ctx,expected_name);
      }
    }
  }
  return &err_struct;
}

Assistant:

D (compound_stmt) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t n, list, r;
  pos_t pos;

  PTE ('{', pos, err0);
  list = new_node (c2m_ctx, N_LIST);
  n = new_pos_node2 (c2m_ctx, N_BLOCK, pos, new_node (c2m_ctx, N_LIST), list);
  n->attr = curr_scope;
  curr_scope = n;
  while (!C ('}') && !C (T_EOFILE)) { /* block-item-list, block_item */
    if ((r = TRY (declaration)) != err_node) {
    } else {
      PE (stmt, err1);
    }
    op_flat_append (c2m_ctx, list, r);
    continue;
  err1:
    error_recovery (c2m_ctx, 1, "<statement>");
  }
  curr_scope = n->attr;
  if (C (T_EOFILE)) {
    error (c2m_ctx, pos, "unfinished compound statement");
    return err_node;
  }
  PT ('}');
  return n;
err0:
  error_recovery (c2m_ctx, 0, "{");
  return err_node;
}